

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

optional<pbrt::QuadricIntersection> * __thiscall
pbrt::Disk::BasicIntersect(Disk *this,Ray *r,Float tMax)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  long in_RSI;
  optional<pbrt::QuadricIntersection> *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  double dVar5;
  undefined1 auVar8 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  Vector3<float> VVar9;
  Point3<float> PVar10;
  Float phi;
  Float dist2;
  Point3f pHit;
  Float tShapeHit;
  Vector3fi di;
  Point3fi oi;
  Vector3fi *in_stack_00000218;
  Transform *in_stack_00000220;
  Point3fi *in_stack_00000378;
  Transform *in_stack_00000380;
  QuadricIntersection *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  float fVar11;
  Point3<pbrt::Interval<float>_> *in_stack_fffffffffffffec8;
  Vector3<pbrt::Interval<float>_> *v;
  Point3<float> *this_00;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  optional<pbrt::QuadricIntersection> *this_01;
  float local_e0;
  Vector3<pbrt::Interval<float>_> local_b4;
  Point3<float> local_98;
  undefined8 local_8c;
  float local_84;
  float local_80;
  float local_1c;
  
  this_01 = in_RDI;
  local_1c = in_XMM0_Da;
  Point3fi::Point3fi((Point3fi *)in_RDI,
                     (Point3f *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  Transform::operator()(in_stack_00000380,in_stack_00000378);
  Vector3fi::Vector3fi
            ((Vector3fi *)this_01,
             (Vector3f *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  Transform::operator()(in_stack_00000220,in_stack_00000218);
  fVar3 = Interval::operator_cast_to_float((Interval<float> *)0x7efedc);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    fVar3 = *(float *)(in_RSI + 0x14);
    fVar4 = Interval::operator_cast_to_float((Interval<float> *)0x7eff29);
    fVar4 = fVar3 - fVar4;
    local_80 = Interval::operator_cast_to_float((Interval<float> *)0x7eff4e);
    local_80 = fVar4 / local_80;
    if ((local_80 <= 0.0) || (local_1c <= local_80)) {
      memset(this_01,0,0x18);
      pstd::optional<pbrt::QuadricIntersection>::optional(this_01);
    }
    else {
      this_00 = &local_98;
      Point3<float>::Point3<pbrt::Interval<float>>(this_00,in_stack_fffffffffffffec8);
      v = &local_b4;
      fVar11 = local_80;
      Vector3<float>::Vector3<pbrt::Interval<float>>((Vector3<float> *)this_00,v);
      auVar8 = (undefined1  [56])0x0;
      VVar9 = pbrt::operator*((float)((ulong)this_01 >> 0x20),
                              (Tuple3<pbrt::Vector3,_float> *)CONCAT44(fVar4,fVar3));
      local_b4.super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.z.high =
           VVar9.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar6._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar6._8_56_ = auVar8;
      local_b4.super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>._12_8_ =
           vmovlpd_avx(auVar6._0_16_);
      PVar10 = Point3<float>::operator+(this_00,(Vector3<float> *)v);
      local_84 = PVar10.super_Tuple3<pbrt::Point3,_float>.z;
      auVar7._0_8_ = PVar10.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar7._8_56_ = auVar8;
      uVar1 = vmovlpd_avx(auVar7._0_16_);
      local_8c._0_4_ = (uint)uVar1;
      local_8c._4_4_ = (float)(uVar1 >> 0x20);
      auVar2 = vfmadd213ss_fma(ZEXT416((uint)local_8c),ZEXT416((uint)local_8c),
                               ZEXT416((uint)(local_8c._4_4_ * local_8c._4_4_)));
      local_8c = uVar1;
      if ((*(float *)(in_RSI + 0x18) * *(float *)(in_RSI + 0x18) < auVar2._0_4_) ||
         (auVar2._0_4_ < *(float *)(in_RSI + 0x1c) * *(float *)(in_RSI + 0x1c))) {
        memset(this_01,0,0x18);
        pstd::optional<pbrt::QuadricIntersection>::optional(this_01);
      }
      else {
        dVar5 = (double)(ulong)(uint)local_8c._4_4_;
        dVar5 = std::atan2(dVar5,(double)(uVar1 & 0xffffffff));
        local_e0 = SUB84(dVar5,0);
        if (local_e0 < 0.0) {
          local_e0 = local_e0 + 6.2831855;
        }
        if (local_e0 <= *(float *)(in_RSI + 0x20)) {
          pstd::optional<pbrt::QuadricIntersection>::optional
                    ((optional<pbrt::QuadricIntersection> *)
                     CONCAT44(fVar11,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8);
        }
        else {
          memset(this_01,0,0x18);
          pstd::optional<pbrt::QuadricIntersection>::optional(this_01);
        }
      }
    }
  }
  else {
    memset(this_01,0,0x18);
    pstd::optional<pbrt::QuadricIntersection>::optional(this_01);
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<QuadricIntersection> BasicIntersect(const Ray &r, Float tMax) const {
        // Transform _Ray_ origin and direction to object space
        Point3fi oi = (*objectFromRender)(Point3fi(r.o));
        Vector3fi di = (*objectFromRender)(Vector3fi(r.d));

        // Compute plane intersection for disk
        // Reject disk intersections for rays parallel to the disk's plane
        if (Float(di.z) == 0)
            return {};

        Float tShapeHit = (height - Float(oi.z)) / Float(di.z);
        if (tShapeHit <= 0 || tShapeHit >= tMax)
            return {};

        // See if hit point is inside disk radii and $\phimax$
        Point3f pHit = Point3f(oi) + (Float)tShapeHit * Vector3f(di);
        Float dist2 = pHit.x * pHit.x + pHit.y * pHit.y;
        if (dist2 > radius * radius || dist2 < innerRadius * innerRadius)
            return {};
        // Test disk $\phi$ value against $\phimax$
        Float phi = std::atan2(pHit.y, pHit.x);
        if (phi < 0)
            phi += 2 * Pi;
        if (phi > phiMax)
            return {};

        // Return _QuadricIntersection_ for disk intersection
        return QuadricIntersection{tShapeHit, pHit, phi};
    }